

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
ast::BinaryOp::BinaryOp(BinaryOp *this,Token *t,int p,int a,int line,NodeType node_type)

{
  Token local_58;
  NodeType local_28;
  int local_24;
  NodeType node_type_local;
  int line_local;
  int a_local;
  int p_local;
  Token *t_local;
  BinaryOp *this_local;
  
  local_28 = node_type;
  local_24 = line;
  node_type_local = a;
  line_local = p;
  _a_local = t;
  t_local = (Token *)this;
  token::Token::Token(&local_58,t);
  Op::Op(&this->super_Op,&local_58,line_local,node_type_local,local_24,local_28);
  token::Token::~Token(&local_58);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__BinaryOp_001e1610;
  this->RightOp = (Expr *)0x0;
  this->LeftOp = (Expr *)0x0;
  return;
}

Assistant:

BinaryOp(Token t, int p, int a, int line, NodeType node_type)
        :Op(t, p, a, line, node_type), RightOp{nullptr}, LeftOp{nullptr} {}